

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O0

void __thiscall
pstore::indirect_string_adder::flush(indirect_string_adder *this,transaction_base *transaction)

{
  raw_sstring_view *str;
  bool bVar1;
  typed_address<pstore::address> *this_00;
  type *ppsVar2;
  type *ptVar3;
  typed_address<pstore::address> local_40;
  reference local_38;
  pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_> *v;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  *__range1;
  transaction_base *transaction_local;
  indirect_string_adder *this_local;
  
  __end1 = std::
           vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
           ::begin(&this->views_);
  v = (pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_> *)
      std::
      vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
      ::end(&this->views_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_*,_std::vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>_>
                                *)&v);
    if (!bVar1) {
      std::
      vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
      ::clear(&this->views_);
      return;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_*,_std::vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>_>
               ::operator*(&__end1);
    this_00 = &local_38->second;
    local_40 = typed_address<pstore::address>::null();
    bVar1 = typed_address<pstore::address>::operator!=(this_00,&local_40);
    if (!bVar1) break;
    ppsVar2 = std::
              get<0ul,pstore::sstring_view<char_const*>const*,pstore::typed_address<pstore::address>>
                        (local_38);
    str = *ppsVar2;
    ptVar3 = std::
             get<1ul,pstore::sstring_view<char_const*>const*,pstore::typed_address<pstore::address>>
                       (local_38);
    indirect_string::write_body_and_patch_address
              (transaction,str,(typed_address<pstore::address>)(ptVar3->a_).a_);
    __gnu_cxx::
    __normal_iterator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_*,_std::vector<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>_>
    ::operator++(&__end1);
  }
  assert_failed("v.second != typed_address<address>::null ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                ,0xa1);
}

Assistant:

void indirect_string_adder::flush (transaction_base & transaction) {
        for (auto const & v : views_) {
            PSTORE_ASSERT (v.second != typed_address<address>::null ());
            indirect_string::write_body_and_patch_address (transaction,
                                                           *std::get<0> (v), // string body
                                                           std::get<1> (v)   // address to patch
            );
        }
        views_.clear ();
    }